

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O1

void __thiscall Kernel::VariableIterator::VariableIterator(VariableIterator *this,TermList t)

{
  TermList ***pppTVar1;
  size_t sVar2;
  uint uVar3;
  TermList **ppTVar4;
  TermList *pTVar5;
  
  (this->super_IteratorCore<Kernel::TermList>)._refCnt = 0;
  (this->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore =
       (_func_int **)&PTR__VariableIterator_00b697b8;
  (this->_stack)._capacity = 8;
  ppTVar4 = (TermList **)
            ::Lib::FixedSizeAllocator<64UL>::alloc
                      ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  (this->_stack)._stack = ppTVar4;
  (this->_stack)._cursor = ppTVar4;
  sVar2 = (this->_stack)._capacity;
  (this->_stack)._end = ppTVar4 + sVar2;
  this->_used = false;
  this->_aux[0]._content = 2;
  this->_aux[1]._content = 2;
  if ((t._content & 1) == 0) {
    if (((*(byte *)(t._content + 0x28) & 8) != 0) &&
       (uVar3 = Term::numVarOccs((Term *)t._content), uVar3 == 0)) {
      return;
    }
    pTVar5 = (TermList *)(t._content + 0x28 + (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8);
    if ((this->_stack)._cursor == (this->_stack)._end) {
      ::Lib::Stack<const_Kernel::TermList_*>::expand(&this->_stack);
    }
  }
  else {
    this->_aux[0]._content = 2;
    pTVar5 = this->_aux + 1;
    this->_aux[1]._content = t._content;
    if (sVar2 == 0) {
      ::Lib::Stack<const_Kernel::TermList_*>::expand(&this->_stack);
    }
  }
  *(this->_stack)._cursor = pTVar5;
  pppTVar1 = &(this->_stack)._cursor;
  *pppTVar1 = *pppTVar1 + 1;
  return;
}

Assistant:

VariableIterator(TermList t) : _stack(8), _used(false)
  {
    if(t.isVar()) {
      // see #hack 1
      _aux[0] = TermList::empty();
      _aux[1]=t;
      _stack.push(&_aux[1]);
    }
    else {
      Term* term=t.term();
      if(!term->shared() || !term->ground()) {
	_stack.push(term->args());
      }
    }
  }